

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

void __thiscall
trun::TestResponseProxy::SetPostCaseCallback(TestResponseProxy *this,CBPrePostHook *cbPostCase)

{
  Ref testModule;
  long local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  TestRunner::GetCurrentTestModule();
  if (local_20 != 0) {
    *(CBPrePostHook *)(local_20 + 0x160) = *cbPostCase;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void TestResponseProxy::SetPostCaseCallback(const CBPrePostHook &cbPostCase) {
    auto testModule = TestRunner::GetCurrentTestModule();
    if (testModule != nullptr) {
        testModule->cbPostHook = cbPostCase;
    }
}